

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VtabMakeWritable(Parse *pParse,Table *pTab)

{
  anon_union_8_2_381ed488_for_u1 aVar1;
  long in_RSI;
  sqlite3 *in_RDI;
  Table **apVtabLock;
  int n;
  int i;
  Parse *pToplevel;
  int iVar2;
  sqlite3 *psVar3;
  
  if (*(long *)(in_RDI->aLimit + 10) != 0) {
    in_RDI = *(sqlite3 **)(in_RDI->aLimit + 10);
  }
  iVar2 = 0;
  while( true ) {
    if (*(int *)&in_RDI->xUpdateCallback <= iVar2) {
      psVar3 = in_RDI;
      aVar1 = (anon_union_8_2_381ed488_for_u1)
              sqlite3Realloc(in_RDI,CONCAT44(iVar2,(*(int *)&in_RDI->xUpdateCallback + 1) * 8));
      if (aVar1 == (anon_union_8_2_381ed488_for_u1)0x0) {
        sqlite3OomFault(in_RDI);
      }
      else {
        psVar3->u1 = aVar1;
        iVar2 = *(int *)&psVar3->xUpdateCallback;
        *(int *)&psVar3->xUpdateCallback = iVar2 + 1;
        *(long *)((long)psVar3->u1 + (long)iVar2 * 8) = in_RSI;
      }
      return;
    }
    if (in_RSI == *(long *)((long)in_RDI->u1 + (long)iVar2 * 8)) break;
    iVar2 = iVar2 + 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabMakeWritable(Parse *pParse, Table *pTab){
  Parse *pToplevel = sqlite3ParseToplevel(pParse);
  int i, n;
  Table **apVtabLock;

  assert( IsVirtual(pTab) );
  for(i=0; i<pToplevel->nVtabLock; i++){
    if( pTab==pToplevel->apVtabLock[i] ) return;
  }
  n = (pToplevel->nVtabLock+1)*sizeof(pToplevel->apVtabLock[0]);
  apVtabLock = sqlite3Realloc(pToplevel->apVtabLock, n);
  if( apVtabLock ){
    pToplevel->apVtabLock = apVtabLock;
    pToplevel->apVtabLock[pToplevel->nVtabLock++] = pTab;
  }else{
    sqlite3OomFault(pToplevel->db);
  }
}